

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_uint stb_crc32_block(stb_uint crc,uchar *buffer,stb_uint len)

{
  uint uVar1;
  uint local_28;
  uint local_24;
  stb_uint s;
  stb_uint j;
  stb_uint i;
  stb_uint len_local;
  uchar *buffer_local;
  stb_uint crc_local;
  
  buffer_local._4_4_ = crc ^ 0xffffffff;
  if (stb_crc32_block::crc_table[1] == 0) {
    for (s = 0; s < 0x100; s = s + 1) {
      local_28 = s;
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        uVar1 = 0;
        if ((local_28 & 1) != 0) {
          uVar1 = 0xedb88320;
        }
        local_28 = local_28 >> 1 ^ uVar1;
      }
      stb_crc32_block::crc_table[s] = local_28;
    }
  }
  for (s = 0; s < len; s = s + 1) {
    buffer_local._4_4_ =
         buffer_local._4_4_ >> 8 ^
         stb_crc32_block::crc_table[(uint)buffer[s] ^ buffer_local._4_4_ & 0xff];
  }
  return buffer_local._4_4_ ^ 0xffffffff;
}

Assistant:

stb_uint stb_crc32_block(stb_uint crc, unsigned char *buffer, stb_uint len)
{
   static stb_uint crc_table[256];
   stb_uint i,j,s;
   crc = ~crc;

   if (crc_table[1] == 0)
      for(i=0; i < 256; i++) {
         for (s=i, j=0; j < 8; ++j)
            s = (s >> 1) ^ (s & 1 ? 0xedb88320 : 0);
         crc_table[i] = s;
      }
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}